

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::multiobjectiveSolve(Highs *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  HighsSolution *pHVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  HighsStatus HVar9;
  HighsStatus HVar10;
  pointer *ppdVar11;
  stringstream *psVar12;
  stringstream *psVar13;
  pointer pHVar14;
  char *pcVar15;
  pointer pHVar16;
  HighsInt iCol_4;
  pointer pHVar17;
  pointer __old_p_3;
  uint uVar18;
  long lVar19;
  HighsInt iCol_1;
  pointer pHVar20;
  HighsInt iCol;
  pointer pHVar21;
  ulong uVar22;
  pointer __old_p;
  HighsInt iCol_3;
  long lVar23;
  ulong uVar24;
  Highs *pHVar25;
  double dVar26;
  bool feasible;
  bool integral;
  stringstream *local_1c0;
  bool valid;
  HighsLp *local_1b0;
  HighsLogOptions *local_1a8;
  HighsInt local_19c;
  pointer local_198;
  undefined8 uStack_190;
  pointer local_188;
  Highs *local_180;
  uint local_174;
  string local_170;
  double local_150;
  pointer local_148;
  long local_140;
  pointer local_138;
  HighsSolution solution;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> priority_objective;
  vector<double,_std::allocator<double>_> value;
  vector<int,_std::allocator<int>_> index;
  string local_70;
  string local_50;
  
  pHVar16 = (this->multi_linear_objective_).
            super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_188 = (pointer)((ulong)((long)(this->multi_linear_objective_).
                                      super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar16) >>
                       6);
  local_1b0 = &(this->model_).lp_;
  pHVar14 = (pointer)0x0;
  pHVar21 = (pointer)0x0;
  if (0 < (int)local_188) {
    pHVar21 = (pointer)((ulong)local_188 & 0xffffffff);
  }
  ppdVar11 = (pointer *)
             ((long)&(pHVar16->coefficients).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl + 8);
  for (; pHVar21 != pHVar14; pHVar14 = (pointer)((long)&pHVar14->weight + 1)) {
    if ((long)*ppdVar11 - (long)((_Vector_impl_data *)(ppdVar11 + -1))->_M_start >> 3 !=
        (long)(this->model_).lp_.num_col_) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Multiple linear objective coefficient vector %d has size incompatible with model\n"
                  );
      return kError;
    }
    ppdVar11 = ppdVar11 + 8;
  }
  local_1a8 = &(this->options_).super_HighsOptionsStruct.log_options;
  highsLogUser(local_1a8,kInfo,"Solving with %d multiple linear objectives, %s\n",local_188);
  pcVar15 = "   coefficients";
  if (9 < ((HighsLp *)&local_1b0->num_col_)->num_col_) {
    pcVar15 = "";
  }
  highsLogUser(local_1a8,kInfo,"Ix      weight      offset     abs_tol     rel_tol    priority%s\n",
               pcVar15);
  pHVar16 = (pointer)0x0;
  psVar13 = (stringstream *)0x0;
  local_180 = this;
  local_138 = pHVar21;
  while (pHVar25 = local_180, pHVar16 != pHVar21) {
    pHVar21 = (local_180->multi_linear_objective_).
              super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>.
              _M_impl.super__Vector_impl_data._M_start + (long)pHVar16;
    local_198 = pHVar16;
    local_1c0 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(local_1c0);
    if (psVar13 != (stringstream *)0x0) {
      (**(code **)(*(long *)psVar13 + 8))(psVar13);
    }
    highsFormatToString_abi_cxx11_
              ((string *)&solution,"%2d %11.6g %11.6g %11.6g %11.6g %11d  ",pHVar21->weight,
               pHVar21->offset,pHVar21->abs_tolerance,pHVar21->rel_tolerance,local_198,
               (ulong)(uint)pHVar21->priority);
    psVar13 = local_1c0 + 0x10;
    std::operator<<((ostream *)psVar13,(string *)&solution);
    std::__cxx11::string::~string((string *)&solution);
    iVar8 = ((HighsLp *)&local_1b0->num_col_)->num_col_;
    if (iVar8 < 10) {
      for (uVar22 = 0; (long)uVar22 < (long)iVar8; uVar22 = uVar22 + 1) {
        pcVar15 = ",";
        if (uVar22 == 0) {
          pcVar15 = "";
        }
        highsFormatToString_abi_cxx11_
                  ((string *)&solution,"%s c_{%1d} = %g",
                   *(undefined8 *)
                    (*(long *)&(pHVar21->coefficients).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar22 * 8),pcVar15,uVar22 & 0xffffffff);
        std::operator<<((ostream *)psVar13,(string *)&solution);
        std::__cxx11::string::~string((string *)&solution);
        iVar8 = ((HighsLp *)&local_1b0->num_col_)->num_col_;
      }
    }
    std::operator<<((ostream *)psVar13,"\n");
    std::__cxx11::stringbuf::str();
    pHVar21 = local_138;
    highsLogUser(local_1a8,kInfo,"%s",solution._0_8_);
    std::__cxx11::string::~string((string *)&solution);
    psVar13 = local_1c0;
    pHVar16 = (pointer)((long)&local_198->weight + 1);
  }
  clearSolver(local_180);
  if ((pHVar25->options_).super_HighsOptionsStruct.blend_multi_objectives == true) {
    (pHVar25->model_).lp_.offset_ = 0.0;
    this_00 = &(pHVar25->model_).lp_.col_cost_;
    solution.value_valid = false;
    solution.dual_valid = false;
    solution._2_6_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (this_00,(long)(pHVar25->model_).lp_.num_col_,(value_type_conflict1 *)&solution);
    pHVar16 = (pHVar25->multi_linear_objective_).
              super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar18 = (pHVar25->model_).lp_.num_col_;
    pHVar17 = (pointer)0x0;
    pHVar14 = (pointer)(ulong)uVar18;
    if ((int)uVar18 < 1) {
      pHVar14 = pHVar17;
    }
    for (; pHVar17 != pHVar21; pHVar17 = (pointer)((long)&pHVar17->weight + 1)) {
      (pHVar25->model_).lp_.offset_ =
           pHVar16[(long)pHVar17].weight * pHVar16[(long)pHVar17].offset +
           (pHVar25->model_).lp_.offset_;
      pdVar3 = (pHVar25->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (pHVar20 = (pointer)0x0; pHVar14 != pHVar20;
          pHVar20 = (pointer)((long)&pHVar20->weight + 1)) {
        pdVar3[(long)pHVar20] =
             pHVar16[(long)pHVar17].weight *
             *(double *)
              (*(long *)&pHVar16[(long)pHVar17].coefficients.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + (long)pHVar20 * 8) + pdVar3[(long)pHVar20];
      }
    }
    (pHVar25->model_).lp_.sense_ = kMinimize;
    local_1c0 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(local_1c0);
    if (psVar13 != (stringstream *)0x0) {
      (**(code **)(*(long *)psVar13 + 8))(psVar13);
    }
    highsFormatToString_abi_cxx11_((string *)&solution,"Solving with blended objective");
    psVar13 = local_1c0 + 0x10;
    std::operator<<((ostream *)psVar13,(string *)&solution);
    std::__cxx11::string::~string((string *)&solution);
    if (((HighsLp *)&local_1b0->num_col_)->num_col_ < 10) {
      pcVar15 = "max";
      if ((pHVar25->model_).lp_.sense_ == kMinimize) {
        pcVar15 = "min";
      }
      highsFormatToString_abi_cxx11_
                ((string *)&solution,": %s %g",(pHVar25->model_).lp_.offset_,pcVar15);
      std::operator<<((ostream *)psVar13,(string *)&solution);
      std::__cxx11::string::~string((string *)&solution);
      for (uVar22 = 0; (long)uVar22 < (long)((HighsLp *)&local_1b0->num_col_)->num_col_;
          uVar22 = uVar22 + 1) {
        highsFormatToString_abi_cxx11_
                  ((string *)&solution," + (%g) x[%d]",
                   (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar22],uVar22 & 0xffffffff);
        std::operator<<((ostream *)psVar13,(string *)&solution);
        std::__cxx11::string::~string((string *)&solution);
      }
    }
    std::operator<<((ostream *)psVar13,"\n");
    std::__cxx11::stringbuf::str();
    highsLogUser(local_1a8,kInfo,"%s",solution._0_8_);
    std::__cxx11::string::~string((string *)&solution);
    psVar13 = local_1c0;
    HVar9 = solve(pHVar25);
    goto LAB_00258e4a;
  }
  if (((int)local_188 < 2) || ((pHVar25->model_).hessian_.dim_ == 0)) {
    bVar7 = hasRepeatedLinearObjectivePriorities(pHVar25,(HighsLinearObjective *)0x0);
    if (bVar7) {
      pcVar15 = "Repeated priorities for lexicographic optimization is illegal\n";
      goto LAB_00258588;
    }
    priority_objective.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    priority_objective.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    priority_objective.
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar19 = 0x38;
    for (lVar23 = 0; (long)pHVar21 << 0x20 != lVar23; lVar23 = lVar23 + 0x100000000) {
      solution._0_8_ =
           (ulong)*(uint *)((long)&((local_180->multi_linear_objective_).
                                    super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->weight + lVar19) +
           lVar23;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 &priority_objective,(pair<int,_int> *)&solution);
      lVar19 = lVar19 + 0x40;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<int,int>,std::pair<int,int>)>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )priority_objective.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )priority_objective.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<bool_(*)(std::pair<int,_int>,_std::pair<int,_int>)>)0x25902f);
    pHVar25 = local_180;
    (local_180->model_).lp_.offset_ = 0.0;
    local_1c0 = (stringstream *)&(local_180->model_).lp_.col_cost_;
    solution.value_valid = false;
    solution.dual_valid = false;
    solution._2_6_ = 0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)local_1c0,
               (long)(local_180->model_).lp_.num_col_,(value_type_conflict1 *)&solution);
    local_19c = (pHVar25->model_).lp_.num_row_;
    std::vector<int,_std::allocator<int>_>::vector
              (&index,(long)(pHVar25->model_).lp_.num_col_,(allocator_type *)&solution);
    std::vector<double,_std::allocator<double>_>::vector
              (&value,(long)((HighsLp *)&local_1b0->num_col_)->num_col_,(allocator_type *)&solution)
    ;
    solution._0_8_ = solution._0_8_ & 0xffffffffffff0000;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solution.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solution.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solution.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    solution.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188 = (pointer)(ulong)((int)local_188 - 1);
    pHVar4 = &pHVar25->solution_;
    pHVar16 = (pointer)0x0;
    while (pHVar16 != local_138) {
      local_174 = priority_objective.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[(long)pHVar16].first;
      lVar19 = (long)priority_objective.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pHVar16].second;
      pHVar21 = (pHVar25->multi_linear_objective_).
                super__Vector_base<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (pHVar25->model_).lp_.offset_ = pHVar21[lVar19].offset;
      local_148 = pHVar16;
      local_140 = lVar19;
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_1c0,&pHVar21[lVar19].coefficients)
      ;
      local_198 = pHVar21 + lVar19;
      bVar7 = 0.0 < local_198->weight;
      (pHVar25->model_).lp_.sense_ = (bVar7 - 1) + (uint)bVar7;
      bVar7 = HighsLp::isMip(local_1b0);
      if ((bVar7) && (solution.value_valid == true)) {
        HVar9 = setSolution(pHVar25,&solution);
        if (HVar9 == kError) {
          highsLogUser(local_1a8,kError,
                       "Failure to use one MIP to provide an integer feasible solution of the next\n"
                      );
          HVar9 = kError;
          returnFromLexicographicOptimization(pHVar25,kError,local_19c);
          goto LAB_00258e0b;
        }
        assessPrimalSolution(pHVar25,&valid,&integral,&feasible);
        if (((valid != true) || (integral != true)) || (feasible == false)) {
          highsBoolToString_abi_cxx11_(&local_170,valid,2);
          _Var5._M_p = local_170._M_dataplus._M_p;
          highsBoolToString_abi_cxx11_(&local_50,integral,2);
          _Var6._M_p = local_50._M_dataplus._M_p;
          highsBoolToString_abi_cxx11_(&local_70,feasible,2);
          highsLogUser(local_1a8,kWarning,
                       "Failure to use one MIP to provide an integer feasible solution of the next: status is valid = %s, integral = %s, feasible = %s\n"
                       ,_Var5._M_p,_Var6._M_p,local_70._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_170);
        }
      }
      psVar12 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar12);
      if (psVar13 != (stringstream *)0x0) {
        (**(code **)(*(long *)psVar13 + 8))(psVar13);
      }
      highsFormatToString_abi_cxx11_(&local_170,"Solving with objective %d",local_140);
      psVar13 = psVar12 + 0x10;
      std::operator<<((ostream *)psVar13,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      if (((HighsLp *)&local_1b0->num_col_)->num_col_ < 10) {
        pcVar15 = "max";
        if ((pHVar25->model_).lp_.sense_ == kMinimize) {
          pcVar15 = "min";
        }
        highsFormatToString_abi_cxx11_(&local_170,": %s %g",(pHVar25->model_).lp_.offset_,pcVar15);
        std::operator<<((ostream *)psVar13,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        for (uVar22 = 0; (long)uVar22 < (long)((HighsLp *)&local_1b0->num_col_)->num_col_;
            uVar22 = uVar22 + 1) {
          highsFormatToString_abi_cxx11_
                    (&local_170," + (%g) x[%d]",*(undefined8 *)(*(long *)local_1c0 + uVar22 * 8),
                     uVar22 & 0xffffffff);
          std::operator<<((ostream *)psVar13,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
        }
      }
      std::operator<<((ostream *)psVar13,"\n");
      std::__cxx11::stringbuf::str();
      HVar9 = kWarning;
      highsLogUser(local_1a8,kInfo,"%s",local_170._M_dataplus._M_p);
      pHVar16 = local_148;
      std::__cxx11::string::~string((string *)&local_170);
      HVar10 = solve(pHVar25);
      psVar13 = psVar12;
      if (HVar10 == kError) {
        HVar9 = kError;
        returnFromLexicographicOptimization(pHVar25,kError,local_19c);
        goto LAB_00258e0b;
      }
      if (pHVar25->model_status_ != kOptimal) {
        modelStatusToString_abi_cxx11_(&local_170,pHVar25,pHVar25->model_status_);
        highsLogUser(local_1a8,kWarning,"After priority %d solve, model status is %s\n",
                     (ulong)local_174,local_170._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_170);
        returnFromLexicographicOptimization(pHVar25,kWarning,local_19c);
        goto LAB_00258e0b;
      }
      if (pHVar16 == local_188) break;
      bVar7 = HighsLp::isMip(local_1b0);
      if (bVar7) {
        std::vector<double,_std::allocator<double>_>::operator=
                  (&solution.col_value,&pHVar4->col_value);
        solution.value_valid = true;
      }
      lVar19 = *(long *)local_1c0;
      uVar18 = 0;
      for (lVar23 = 0; lVar23 < ((HighsLp *)&local_1b0->num_col_)->num_col_; lVar23 = lVar23 + 1) {
        dVar1 = *(double *)(lVar19 + lVar23 * 8);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)uVar18] = (int)lVar23;
          value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)uVar18] = dVar1;
          uVar18 = uVar18 + 1;
        }
      }
      dVar1 = (pHVar25->info_).super_HighsInfoStruct.objective_function_value;
      dVar2 = local_198->abs_tolerance;
      dVar26 = local_198->rel_tolerance;
      uVar22 = -(ulong)(dVar2 < 0.0);
      if ((pHVar25->model_).lp_.sense_ == kMinimize) {
        local_198 = (pointer)(uVar22 & 0x7ff0000000000000 | ~uVar22 & (ulong)(dVar1 + dVar2));
        if (0.0 <= dVar26) {
          if (0.0 <= dVar1) {
            dVar26 = dVar26 + 1.0;
          }
          else {
            if (0.0 <= dVar1) goto LAB_00258b26;
            dVar26 = 1.0 - dVar26;
          }
          if (dVar1 * dVar26 <= (double)local_198) {
            local_198 = (pointer)(dVar1 * dVar26);
          }
        }
LAB_00258b26:
        local_198 = (pointer)((double)local_198 - (pHVar25->model_).lp_.offset_);
        local_150 = -INFINITY;
      }
      else {
        local_150 = (double)(uVar22 & 0xfff0000000000000 | ~uVar22 & (ulong)(dVar1 - dVar2));
        if (0.0 <= dVar26) {
          if (0.0 <= dVar1) {
            dVar26 = 1.0 - dVar26;
          }
          else {
            if (0.0 <= dVar1) goto LAB_00258b5d;
            dVar26 = dVar26 + 1.0;
          }
          if (local_150 <= dVar1 * dVar26) {
            local_150 = dVar1 * dVar26;
          }
        }
LAB_00258b5d:
        local_150 = local_150 - (pHVar25->model_).lp_.offset_;
        local_198 = (pointer)&DAT_7ff0000000000000;
      }
      uStack_190 = 0;
      if ((local_150 <= -INFINITY) && (INFINITY <= (double)local_198)) {
        highsLogUser(local_1a8,kWarning,
                     "After priority %d solve, no objective constraint due to absolute tolerance being %g < 0, and relative tolerance being %g < 0\n"
                     ,(ulong)local_174);
      }
      psVar13 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar13);
      (**(code **)(*(long *)psVar12 + 8))(psVar12);
      highsFormatToString_abi_cxx11_(&local_170,"Add constraint for objective %d: ",local_140);
      psVar12 = psVar13 + 0x10;
      std::operator<<((ostream *)psVar12,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      if ((int)uVar18 < 10) {
        highsFormatToString_abi_cxx11_(&local_170,"%g <= ",local_150);
        std::operator<<((ostream *)psVar12,(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        uVar22 = 0;
        if (0 < (int)uVar18) {
          uVar22 = (ulong)uVar18;
        }
        for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
          pcVar15 = " + ";
          if (uVar24 == 0) {
            pcVar15 = "";
          }
          highsFormatToString_abi_cxx11_
                    (&local_170,"%s(%g) x[%d]",
                     value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar24],pcVar15,
                     (ulong)(uint)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar24]);
          std::operator<<((ostream *)psVar12,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
        }
        highsFormatToString_abi_cxx11_(&local_170," <= %g\n",local_198);
        std::operator<<((ostream *)psVar12,(string *)&local_170);
        pHVar25 = local_180;
      }
      else {
        highsFormatToString_abi_cxx11_(&local_170,"Bounds [%g, %g]\n",local_150,local_198);
        std::operator<<((ostream *)psVar12,(string *)&local_170);
      }
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::stringbuf::str();
      highsLogUser(local_1a8,kInfo,"%s",local_170._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_170);
      addRow(pHVar25,local_150,(double)local_198,uVar18,
             index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pHVar16 = (pointer)((long)&local_148->weight + 1);
    }
    HVar9 = kOk;
    returnFromLexicographicOptimization(pHVar25,kOk,local_19c);
LAB_00258e0b:
    HighsSolution::~HighsSolution(&solution);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&value.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&index.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&priority_objective.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  else {
    pcVar15 = "Cannot perform non-trivial lexicographic optimization for QP\n";
LAB_00258588:
    highsLogUser(local_1a8,kError,pcVar15);
    HVar9 = kError;
  }
  if (psVar13 == (stringstream *)0x0) {
    return HVar9;
  }
LAB_00258e4a:
  (**(code **)(*(long *)psVar13 + 8))(psVar13);
  return HVar9;
}

Assistant:

HighsStatus Highs::multiobjectiveSolve() {
  const HighsInt coeff_logging_size_limit = 10;
  HighsInt num_linear_objective = this->multi_linear_objective_.size();

  assert(num_linear_objective > 0);
  HighsLp& lp = this->model_.lp_;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& multi_linear_objective =
        this->multi_linear_objective_[iObj];
    if (multi_linear_objective.coefficients.size() !=
        static_cast<size_t>(lp.num_col_)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Multiple linear objective coefficient vector %d has size "
                   "incompatible with model\n",
                   int(iObj));
      return HighsStatus::kError;
    }
  }

  std::unique_ptr<std::stringstream> multi_objective_log;
  highsLogUser(options_.log_options, HighsLogType::kInfo,
               "Solving with %d multiple linear objectives, %s\n",
               int(num_linear_objective),
               this->options_.blend_multi_objectives
                   ? "blending objectives by weight"
                   : "using lexicographic optimization by priority");
  highsLogUser(
      options_.log_options, HighsLogType::kInfo,
      "Ix      weight      offset     abs_tol     rel_tol    priority%s\n",
      lp.num_col_ < coeff_logging_size_limit ? "   coefficients" : "");
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "%2d %11.6g %11.6g %11.6g %11.6g %11d  ", int(iObj),
        linear_objective.weight, linear_objective.offset,
        linear_objective.abs_tolerance, linear_objective.rel_tolerance,
        linear_objective.priority);
    if (lp.num_col_ < coeff_logging_size_limit) {
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            "%s c_{%1d} = %g", iCol == 0 ? "" : ",", int(iCol),
            linear_objective.coefficients[iCol]);
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
  }
  this->clearSolver();
  if (this->options_.blend_multi_objectives) {
    // Objectives are blended by weight and minimized
    lp.offset_ = 0;
    lp.col_cost_.assign(lp.num_col_, 0);
    for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
      HighsLinearObjective& multi_linear_objective =
          this->multi_linear_objective_[iObj];
      lp.offset_ +=
          multi_linear_objective.weight * multi_linear_objective.offset;
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        lp.col_cost_[iCol] += multi_linear_objective.weight *
                              multi_linear_objective.coefficients[iCol];
    }
    lp.sense_ = ObjSense::kMinimize;

    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Solving with blended objective");
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    return this->solve();
  }

  // Objectives are applied lexicographically
  if (model_.isQp() && num_linear_objective > 1) {
    // Lexicographic optimization with a single linear objective is
    // trivially standard optimization, so is OK
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Cannot perform non-trivial lexicographic optimization for QP\n");
    return HighsStatus::kError;
  }
  // Check whether there are repeated linear objective priorities
  if (hasRepeatedLinearObjectivePriorities()) {
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Repeated priorities for lexicographic optimization is illegal\n");
    return HighsStatus::kError;
  }
  std::vector<std::pair<HighsInt, HighsInt>> priority_objective;

  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++)
    priority_objective.push_back(
        std::make_pair(this->multi_linear_objective_[iObj].priority, iObj));
  std::sort(priority_objective.begin(), priority_objective.end(), comparison);
  // Clear LP objective
  lp.offset_ = 0;
  lp.col_cost_.assign(lp.num_col_, 0);
  const HighsInt original_lp_num_row = lp.num_row_;
  std::vector<HighsInt> index(lp.num_col_);
  std::vector<double> value(lp.num_col_);
  // Use the solution of one MIP to provide an integer feasible
  // solution of the next
  HighsSolution solution;
  for (HighsInt iIx = 0; iIx < num_linear_objective; iIx++) {
    HighsInt priority = priority_objective[iIx].first;
    HighsInt iObj = priority_objective[iIx].second;
    // Use this objective
    HighsLinearObjective& linear_objective =
        this->multi_linear_objective_[iObj];
    lp.offset_ = linear_objective.offset;
    lp.col_cost_ = linear_objective.coefficients;
    lp.sense_ =
        linear_objective.weight > 0 ? ObjSense::kMinimize : ObjSense::kMaximize;
    if (lp.isMip() && solution.value_valid) {
      HighsStatus set_solution_status = this->setSolution(solution);
      if (set_solution_status == HighsStatus::kError) {
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next\n");
        return returnFromLexicographicOptimization(HighsStatus::kError,
                                                   original_lp_num_row);
      }
      bool valid, integral, feasible;
      HighsStatus assess_primal_solution =
          assessPrimalSolution(valid, integral, feasible);
      if (!valid || !integral || !feasible) {
        highsLogUser(options_.log_options, HighsLogType::kWarning,
                     "Failure to use one MIP to provide an integer feasible "
                     "solution of the next: "
                     "status is valid = %s, integral = %s, feasible = %s\n",
                     highsBoolToString(valid).c_str(),
                     highsBoolToString(integral).c_str(),
                     highsBoolToString(feasible).c_str());
      }
    }
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString("Solving with objective %d",
                                                int(iObj));
    if (lp.num_col_ < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString(
          ": %s %g", lp.sense_ == ObjSense::kMinimize ? "min" : "max",
          lp.offset_);
      for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
        *multi_objective_log << highsFormatToString(
            " + (%g) x[%d]", lp.col_cost_[iCol], int(iCol));
    }
    *multi_objective_log << "\n";
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    HighsStatus solve_status = this->solve();
    if (solve_status == HighsStatus::kError)
      return returnFromLexicographicOptimization(HighsStatus::kError,
                                                 original_lp_num_row);
    if (model_status_ != HighsModelStatus::kOptimal) {
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, model status is %s\n",
                   int(priority), modelStatusToString(model_status_).c_str());
      return returnFromLexicographicOptimization(HighsStatus::kWarning,
                                                 original_lp_num_row);
    }
    if (iIx == num_linear_objective - 1) break;
    if (lp.isMip()) {
      // Save the solution to provide an integer feasible solution of
      // the next MIP
      solution.col_value = this->solution_.col_value;
      solution.value_valid = true;
    }
    // Add the constraint
    HighsInt nnz = 0;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      if (lp.col_cost_[iCol]) {
        index[nnz] = iCol;
        value[nnz] = lp.col_cost_[iCol];
        nnz++;
      }
    }
    double objective = info_.objective_function_value;
    HighsStatus add_row_status;
    double lower_bound = -kHighsInf;
    double upper_bound = kHighsInf;
    if (lp.sense_ == ObjSense::kMinimize) {
      // Minimizing, so set a greater upper bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        upper_bound = objective + linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          upper_bound = std::min(
              objective * (1.0 + linear_objective.rel_tolerance), upper_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          upper_bound = std::min(
              objective * (1.0 - linear_objective.rel_tolerance), upper_bound);
        }
      }
      upper_bound -= lp.offset_;
    } else {
      // Maximizing, so set a lesser lower bound than the objective
      if (linear_objective.abs_tolerance >= 0)
        lower_bound = objective - linear_objective.abs_tolerance;
      if (linear_objective.rel_tolerance >= 0) {
        if (objective >= 0) {
          // Guarantees objective of at most (1-t).f^*
          //
          // so ((1-t).f^*-f^*)/f^* = -t
          lower_bound = std::max(
              objective * (1.0 - linear_objective.rel_tolerance), lower_bound);
        } else if (objective < 0) {
          // Guarantees objective of at least (1+t).f^*
          //
          // so ((1+t).f^*-f^*)/f^* = t
          lower_bound = std::max(
              objective * (1.0 + linear_objective.rel_tolerance), lower_bound);
        }
      }
      lower_bound -= lp.offset_;
    }
    if (lower_bound == -kHighsInf && upper_bound == kHighsInf)
      highsLogUser(options_.log_options, HighsLogType::kWarning,
                   "After priority %d solve, no objective constraint due to "
                   "absolute tolerance being %g < 0,"
                   " and relative tolerance being %g < 0\n",
                   int(priority), linear_objective.abs_tolerance,
                   linear_objective.rel_tolerance);
    multi_objective_log =
        std::unique_ptr<std::stringstream>(new std::stringstream());
    *multi_objective_log << highsFormatToString(
        "Add constraint for objective %d: ", int(iObj));
    if (nnz < coeff_logging_size_limit) {
      *multi_objective_log << highsFormatToString("%g <= ", lower_bound);
      for (HighsInt iEl = 0; iEl < nnz; iEl++)
        *multi_objective_log << highsFormatToString(
            "%s(%g) x[%d]", iEl > 0 ? " + " : "", value[iEl], int(index[iEl]));
      *multi_objective_log << highsFormatToString(" <= %g\n", upper_bound);
    } else {
      *multi_objective_log << highsFormatToString("Bounds [%g, %g]\n",
                                                  lower_bound, upper_bound);
    }
    highsLogUser(options_.log_options, HighsLogType::kInfo, "%s",
                 multi_objective_log->str().c_str());
    add_row_status =
        this->addRow(lower_bound, upper_bound, nnz, index.data(), value.data());
    assert(add_row_status == HighsStatus::kOk);
  }
  return returnFromLexicographicOptimization(HighsStatus::kOk,
                                             original_lp_num_row);
}